

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void trophy_corpse(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *pOVar5;
  TROPHY_DATA *pTVar6;
  TROPHY_DATA *pTVar7;
  long in_RSI;
  CHAR_DATA *in_RDI;
  int scalps;
  int i;
  TROPHY_DATA *placeholder;
  OBJ_AFFECT_DATA oaf;
  OBJ_DATA *newbelt;
  OBJ_DATA *belt;
  OBJ_DATA *corpse;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int iVar8;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  OBJ_DATA *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffb3;
  int in_stack_ffffffffffffffb4;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffbc;
  CHAR_DATA *in_stack_ffffffffffffffc0;
  OBJ_DATA *local_18;
  
  local_18 = in_RDI->in_room->contents;
  while ((local_18 != (OBJ_DATA *)0x0 &&
         (bVar1 = str_cmp(local_18->owner,*(char **)(in_RSI + 0xf0)), bVar1))) {
    local_18 = local_18->next_content;
  }
  pOVar5 = get_eq_char(in_RDI,0xd);
  if (((local_18 != (OBJ_DATA *)0x0) && (pOVar5 != (OBJ_DATA *)0x0)) &&
     (pOVar5->pIndexData->vnum == 0x5c5d)) {
    iVar2 = number_percent();
    iVar3 = get_skill((CHAR_DATA *)newbelt,oaf.end_fun._4_4_);
    if (iVar3 + 8 < iVar2) {
      act(in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
          (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (void *)CONCAT44(iVar2,in_stack_ffffffffffffff68),0);
      act(in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
          (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (void *)CONCAT44(iVar2,in_stack_ffffffffffffff68),0);
      check_improve((CHAR_DATA *)oaf._48_8_,oaf.bitvector[1]._4_4_,oaf.bitvector[1]._3_1_,
                    oaf.bitvector[0]._4_4_);
    }
    else {
      act(in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
          (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (void *)CONCAT44(iVar2,in_stack_ffffffffffffff68),0);
      act(in_stack_ffffffffffffff80,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
          (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (void *)CONCAT44(iVar2,in_stack_ffffffffffffff68),0);
      check_improve((CHAR_DATA *)oaf._48_8_,oaf.bitvector[1]._4_4_,oaf.bitvector[1]._3_1_,
                    oaf.bitvector[0]._4_4_);
      if (in_RDI->pcdata->trophy == (TROPHY_DATA *)0x0) {
        pOVar5->value[4] = 0;
      }
      iVar3 = pOVar5->value[4];
      extract_obj(in_stack_ffffffffffffff90);
      get_obj_index(in_stack_ffffffffffffff7c);
      pOVar5 = create_object((OBJ_INDEX_DATA *)oaf.next,placeholder._4_4_);
      obj_to_char((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  (CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
      pOVar5->value[4] = iVar3;
      init_affect_obj((OBJ_AFFECT_DATA *)0x5e5d49);
      uVar9 = 2;
      affect_to_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    (OBJ_AFFECT_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
      iVar3 = (pOVar5->value[4] + 1) / 2;
      iVar4 = (iVar3 - pOVar5->value[4] % 2) + 1;
      iVar8 = 1;
      std::max<int>((int *)&stack0xffffffffffffff74,(int *)&stack0xffffffffffffff70);
      affect_to_obj((OBJ_DATA *)CONCAT44(iVar4,iVar8),(OBJ_AFFECT_DATA *)CONCAT44(iVar2,iVar3));
      equip_char(in_stack_ffffffffffffffc0,(OBJ_DATA *)CONCAT44(in_stack_ffffffffffffffbc,uVar9),
                 in_stack_ffffffffffffffb4,(bool)in_stack_ffffffffffffffb3);
      if (pOVar5->value[4] == 0) {
        pTVar6 = new_trophy_data((char *)CONCAT44(iVar4,iVar8));
        in_RDI->pcdata->trophy = pTVar6;
      }
      else {
        pTVar6 = in_RDI->pcdata->trophy;
        iVar2 = 1;
        while (((iVar2 < pOVar5->value[4] && (in_RDI->pcdata->trophy != (TROPHY_DATA *)0x0)) &&
               (in_RDI->pcdata->trophy->next != (TROPHY_DATA *)0x0))) {
          in_RDI->pcdata->trophy = in_RDI->pcdata->trophy->next;
          iVar2 = iVar2 + 1;
        }
        pTVar7 = new_trophy_data((char *)CONCAT44(iVar4,iVar8));
        in_RDI->pcdata->trophy->next = pTVar7;
        in_RDI->pcdata->trophy = pTVar7;
        in_RDI->pcdata->trophy = pTVar6;
      }
      pOVar5->value[4] = pOVar5->value[4] + 1;
    }
  }
  return;
}

Assistant:

void trophy_corpse(CHAR_DATA *ch, CHAR_DATA *victim)
{
	OBJ_DATA *corpse, *belt, *newbelt;
	OBJ_AFFECT_DATA oaf;
	TROPHY_DATA *placeholder;
	int i, scalps;

	for (corpse = ch->in_room->contents; corpse; corpse = corpse->next_content)
	{
		if (!str_cmp(corpse->owner, victim->true_name))
			break;
	}

	belt = get_eq_char(ch, WEAR_WAIST);

	if (!corpse || !belt || belt->pIndexData->vnum != OBJ_VNUM_TROPHY_BELT)
		return;

	if (number_percent() > get_skill(ch, gsn_trophy) + 8)
	{
		act("You mangle $N's scalp beyond repair in your attempt to trophy it, and throw it away in disgust.", ch, 0, victim, TO_CHAR);
		act("$n mangles $N's scalp beyond repair in $s attempt to trophy it, and throws it away in disgust.", ch, 0, victim, TO_NOTVICT);
		check_improve(ch, gsn_trophy, false, 1);
		return;
	}

	act("With a smooth stroke, you slice $N's scalp cleanly from $S head, attaching it to your belt!", ch, 0, victim, TO_CHAR);
	act("$n smoothly slices $N's scalp from $S head and attaches it to $s belt!", ch, 0, victim, TO_NOTVICT);
	check_improve(ch, gsn_trophy, true, 1);

	if (!ch->pcdata->trophy)
		belt->value[4] = 0;

	/* Update the hit/dam mods on the belt. */

	scalps = belt->value[4];

	extract_obj(belt);

	newbelt = create_object(get_obj_index(23645), 0);
	obj_to_char(newbelt, ch);

	newbelt->value[4] = scalps;

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_APPLY;
	oaf.type = gsn_trophy;
	oaf.aftype = AFT_POWER;
	oaf.level = ch->level;
	oaf.duration = -1;
	oaf.modifier = (newbelt->value[4] + 1) / 2;
	oaf.location = APPLY_HITROLL;
	affect_to_obj(newbelt, &oaf);

	oaf.location = APPLY_DAMROLL;
	oaf.modifier = std::max((newbelt->value[4] + 1) / 2 - (newbelt->value[4] % 2) + 1, 1);
	affect_to_obj(newbelt, &oaf);

	equip_char(ch, newbelt, WEAR_WAIST, false);

	/* Handling of keeping track of the victims trophied on the belt. */

	if (newbelt->value[4] == 0)
	{

		ch->pcdata->trophy = new_trophy_data(victim->true_name);
	}
	else
	{
		placeholder = ch->pcdata->trophy;

		for (i = 1; i < newbelt->value[4]; i++)
		{
			if (!ch->pcdata->trophy)
				break;

			if (!ch->pcdata->trophy->next)
				break;

			ch->pcdata->trophy = ch->pcdata->trophy->next;
		}

		ch->pcdata->trophy = ch->pcdata->trophy->next = new_trophy_data(victim->true_name);
		ch->pcdata->trophy = placeholder;
	}

	newbelt->value[4]++;
}